

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_binding.cpp
# Opt level: O3

void lumeview::ImGui_InvalidateDeviceObjects(void)

{
  ImGuiIO *pIVar1;
  
  if (g_VboHandle != 0) {
    (*glad_glDeleteBuffers)(1,(GLuint *)&g_VboHandle);
  }
  if (g_ElementsHandle != 0) {
    (*glad_glDeleteBuffers)(1,(GLuint *)&g_ElementsHandle);
  }
  g_ElementsHandle = 0;
  g_VboHandle = 0;
  if (g_VertHandle != 0 && g_ShaderHandle != 0) {
    (*glad_glDetachShader)(g_ShaderHandle,g_VertHandle);
  }
  if (g_VertHandle != 0) {
    (*glad_glDeleteShader)(g_VertHandle);
  }
  g_VertHandle = 0;
  if (g_FragHandle != 0 && g_ShaderHandle != 0) {
    (*glad_glDetachShader)(g_ShaderHandle,g_FragHandle);
  }
  if (g_FragHandle != 0) {
    (*glad_glDeleteShader)(g_FragHandle);
  }
  g_FragHandle = 0;
  if (g_ShaderHandle != 0) {
    (*glad_glDeleteProgram)(g_ShaderHandle);
  }
  g_ShaderHandle = 0;
  if (g_FontTexture != 0) {
    (*glad_glDeleteTextures)(1,(GLuint *)&g_FontTexture);
    pIVar1 = ImGui::GetIO();
    pIVar1->Fonts->TexID = (ImTextureID)0x0;
    g_FontTexture = 0;
  }
  return;
}

Assistant:

void    ImGui_InvalidateDeviceObjects()
{
    if (g_VboHandle) glDeleteBuffers(1, &g_VboHandle);
    if (g_ElementsHandle) glDeleteBuffers(1, &g_ElementsHandle);
    g_VboHandle = g_ElementsHandle = 0;

    if (g_ShaderHandle && g_VertHandle) glDetachShader(g_ShaderHandle, g_VertHandle);
    if (g_VertHandle) glDeleteShader(g_VertHandle);
    g_VertHandle = 0;

    if (g_ShaderHandle && g_FragHandle) glDetachShader(g_ShaderHandle, g_FragHandle);
    if (g_FragHandle) glDeleteShader(g_FragHandle);
    g_FragHandle = 0;

    if (g_ShaderHandle) glDeleteProgram(g_ShaderHandle);
    g_ShaderHandle = 0;

    if (g_FontTexture)
    {
        glDeleteTextures(1, &g_FontTexture);
        ImGui::GetIO().Fonts->TexID = 0;
        g_FontTexture = 0;
    }
}